

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O2

void __thiscall Mask::MoveBack(Mask *this)

{
  int *piVar1;
  int iVar2;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar2 = (this->super_MobileElement).start_;
  if (0 < iVar2) {
    (this->super_MobileElement).start_ = iVar2 + -1;
    piVar1 = &(this->super_MobileElement).footprint_;
    *piVar1 = *piVar1 + 1;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_58,"Attempting to assign negative start position to Mask object \'",
                 &(this->super_MobileElement).name_);
  std::operator+(&local_38,&bStack_58,"\'.");
  std::runtime_error::runtime_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Mask::MoveBack() {
  if (start_ > 0) {
    start_--;
    footprint_++;
  } else {
    throw std::runtime_error(
        "Attempting to assign negative start position to Mask object '" +
        name_ + "'.");
  }
}